

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::Read(ON_Viewport *this,ON_BinaryArchive *file)

{
  bool *__dest;
  bool *b_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  view_projection vVar4;
  ON_Viewport *source_viewport;
  double dVar5;
  bool b;
  int minor_version;
  int i;
  int major_version;
  double scaleZ;
  double scaleY;
  double scaleX;
  bool local_71;
  ON_BinaryArchive *local_70;
  int local_64;
  ON__INT32 local_60;
  int local_5c;
  double local_58;
  double local_50;
  ON_3dPoint local_48;
  
  source_viewport = &DefaultTopViewYUp;
  ON_Object::operator=((ON_Object *)this,(ON_Object *)&DefaultTopViewYUp);
  __dest = &this->m_bValidCamera;
  memcpy(__dest,&DefaultTopViewYUp.m_bValidCamera,0x220);
  this->m_bValidCamera = false;
  uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
  this->m_bValidFrustum = false;
  this->m_bValidPort = false;
  this->m_bValidCameraFrame = false;
  *(undefined8 *)(this->m_projection_content_sha1).m_digest =
       ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
  *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar1;
  *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
       ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  local_5c = 0;
  local_64 = 1;
  bVar2 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_5c,&local_64);
  if (!bVar2) {
    return bVar2;
  }
  if (local_5c != 1) {
    return bVar2;
  }
  b_00 = &this->m_bValidCameraFrame;
  local_60 = 0;
  bVar2 = ON_BinaryArchive::ReadInt(file,&local_60);
  if (bVar2) {
    *__dest = local_60 != 0;
    *b_00 = local_60 != 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,&local_60);
    if (!bVar2) goto LAB_00664c23;
    this->m_bValidFrustum = local_60 != 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,&local_60);
    if (!bVar2) goto LAB_00664c23;
    this->m_bValidPort = local_60 != 0;
    bVar2 = ON_BinaryArchive::ReadInt(file,&local_60);
    if (!bVar2) goto LAB_00664c23;
    vVar4 = ON::ViewProjection(local_60);
    this->m_projection = vVar4;
    bVar2 = ON_BinaryArchive::ReadPoint(file,&this->m_CamLoc);
    if (((((!bVar2) || (bVar2 = ON_BinaryArchive::ReadVector(file,&this->m_CamDir), !bVar2)) ||
         (bVar2 = ON_BinaryArchive::ReadVector(file,&this->m_CamUp), !bVar2)) ||
        (((bVar2 = ON_BinaryArchive::ReadVector(file,&this->m_CamX), !bVar2 ||
          (bVar2 = ON_BinaryArchive::ReadVector(file,&this->m_CamY), !bVar2)) ||
         ((bVar2 = ON_BinaryArchive::ReadVector(file,&this->m_CamZ), !bVar2 ||
          ((bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_left), !bVar2 ||
           (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_right), !bVar2)))))))) ||
       (bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_bottom), !bVar2)) goto LAB_00664c23;
    local_70 = file;
    bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_frus_top);
    if (((((bVar2) && (bVar2 = ON_BinaryArchive::ReadDouble(local_70,&this->m_frus_near), bVar2)) &&
         (bVar2 = ON_BinaryArchive::ReadDouble(local_70,&this->m_frus_far), bVar2)) &&
        ((bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_left), bVar2 &&
         (bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_right), bVar2)))) &&
       ((bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_bottom), bVar2 &&
        ((bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_top), bVar2 &&
         (bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_near), file = local_70, bVar2))))
       )) {
      bVar2 = ON_BinaryArchive::ReadInt(local_70,&this->m_port_far);
    }
    else {
      bVar2 = false;
      file = local_70;
    }
  }
  else {
LAB_00664c23:
    bVar2 = false;
  }
  if (*__dest == true) {
    local_48.z = (this->m_CamLoc).z;
    local_48.x = (this->m_CamLoc).x;
    local_48.y = (this->m_CamLoc).y;
    bVar3 = ON_3dPoint::IsValid(&local_48);
    if (((!bVar3) || (dVar5 = ON_3dPoint::MaximumCoordinate(&local_48), 1e+100 <= dVar5)) ||
       (dVar5 < 0.0)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x13c,"","ON_Viewport.m_bValidCamera in file was true and it should be false.");
      *__dest = false;
    }
    local_48.z = (this->m_CamUp).z;
    local_48.x = (this->m_CamUp).x;
    local_48.y = (this->m_CamUp).y;
    bVar3 = ON_3dVector::IsValid((ON_3dVector *)&local_48);
    if (((!bVar3) ||
        (dVar5 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_48), 1e+100 <= dVar5)) ||
       (dVar5 <= 2.3283064365386963e-10)) {
LAB_00664d22:
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
                 ,0x141,"","ON_Viewport.m_bValidCamera in file was true and it should be false.");
      *__dest = false;
      *b_00 = false;
    }
    else {
      local_48.z = (this->m_CamDir).z;
      local_48.x = (this->m_CamDir).x;
      local_48.y = (this->m_CamDir).y;
      bVar3 = ON_3dVector::IsValid((ON_3dVector *)&local_48);
      if (((!bVar3) ||
          (dVar5 = ON_3dVector::MaximumCoordinate((ON_3dVector *)&local_48), 1e+100 <= dVar5)) ||
         (dVar5 <= 2.3283064365386963e-10)) goto LAB_00664d22;
      if ((*__dest & 1U) != 0) goto LAB_00664d69;
    }
    if (this->m_projection == perspective_view) {
      source_viewport = &DefaultPerspectiveViewZUp;
    }
    SetCamera(this,source_viewport,true);
  }
LAB_00664d69:
  if ((((0 < local_64 & bVar2) != 1) ||
      (bVar2 = ON_BinaryArchive::ReadUuid(file,&this->m_viewport_id), !bVar2)) || (local_64 < 2))
  goto LAB_00664efc;
  local_71 = false;
  bVar2 = ON_BinaryArchive::ReadBool(file,&local_71);
  if (bVar2) {
    this->m_bLockCamUp = local_71;
    local_71 = false;
    bVar2 = ON_BinaryArchive::ReadBool(file,&local_71);
    if (!bVar2) goto LAB_00664ef5;
    this->m_bLockCamDir = local_71;
    local_71 = false;
    bVar2 = ON_BinaryArchive::ReadBool(file,&local_71);
    if (!bVar2) goto LAB_00664ef5;
    this->m_bLockCamLoc = local_71;
    local_71 = false;
    bVar2 = ON_BinaryArchive::ReadBool(file,&local_71);
    if (bVar2) {
      this->m_frustum_symmetry_flags = local_71 * '\x02' | this->m_frustum_symmetry_flags & 0xfd;
      local_71 = false;
      bVar2 = ON_BinaryArchive::ReadBool(file,&local_71);
      if (bVar2) {
        this->m_frustum_symmetry_flags = this->m_frustum_symmetry_flags & 0xfe | local_71;
        bVar2 = true;
        if (((local_64 < 3) ||
            (bVar2 = ON_BinaryArchive::ReadPoint(file,&this->m_target_point), !bVar2)) ||
           ((local_64 < 4 ||
            ((bVar2 = ON_BinaryArchive::ReadBool(file,b_00), !bVar2 || (local_64 < 5))))))
        goto LAB_00664efc;
        local_48.x = 1.0;
        local_50 = 1.0;
        local_58 = 1.0;
        bVar2 = ON_BinaryArchive::ReadDouble(file,&local_48.x);
        if ((bVar2) &&
           ((bVar2 = ON_BinaryArchive::ReadDouble(file,&local_50), bVar2 &&
            (bVar2 = ON_BinaryArchive::ReadDouble(file,&local_58), bVar2)))) {
          SetViewScale(this,local_48.x,local_50,local_58);
          bVar2 = true;
          goto LAB_00664efc;
        }
      }
    }
  }
  else {
LAB_00664ef5:
    local_71 = false;
  }
  bVar2 = false;
LAB_00664efc:
  if (this->m_bValidFrustum == true) {
    bVar3 = ON_IsValid(this->m_frus_left);
    if (((((bVar3) && (bVar3 = ON_IsValid(this->m_frus_right), bVar3)) &&
         (bVar3 = ON_IsValid(this->m_frus_top), bVar3)) &&
        ((bVar3 = ON_IsValid(this->m_frus_bottom), bVar3 &&
         (bVar3 = ON_IsValid(this->m_frus_near), bVar3)))) &&
       (bVar3 = ON_IsValid(this->m_frus_far), bVar3)) {
      if (this->m_frus_left < this->m_frus_right) {
        if ((((this->m_frus_bottom < this->m_frus_top) && (0.0 < this->m_frus_near)) &&
            ((this->m_frus_far < 1e+100 &&
             (((this->m_frus_top < 1e+100 && (-1e+100 < this->m_frus_bottom)) &&
              (this->m_frus_right < 1e+100)))))) &&
           ((-1e+100 < this->m_frus_left && (this->m_frus_near < this->m_frus_far)))) {
          return bVar2;
        }
      }
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_viewport.cpp"
               ,0x194,"","ON_Viewport.m_bValidFrustum in file was true and it should be false.");
    this->m_bValidFrustum = false;
  }
  return bVar2;
}

Assistant:

bool ON_Viewport::Read( ON_BinaryArchive& file )
{
  *this = ON_Viewport::DefaultTopViewYUp;

  m_bValidCamera = false;
  m_bValidFrustum = false;
  m_bValidPort = false;
  m_bValidCameraFrame = false;

  m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;

  int major_version = 0;
  int minor_version = 1;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    // common to all 1.x versions
    int i=0;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidCamera = (i?true:false);
    if (rc)
      m_bValidCameraFrame = m_bValidCamera;
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidFrustum = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_bValidPort = (i?true:false);
    if (rc) rc = file.ReadInt( &i );
    if (rc) m_projection = ON::ViewProjection(i);
    if (rc) rc = file.ReadPoint( m_CamLoc );
    if (rc) rc = file.ReadVector( m_CamDir );
    if (rc) rc = file.ReadVector( m_CamUp );
    if (rc) rc = file.ReadVector( m_CamX );
    if (rc) rc = file.ReadVector( m_CamY );
    if (rc) rc = file.ReadVector( m_CamZ );
    if (rc) rc = file.ReadDouble( &m_frus_left );
    if (rc) rc = file.ReadDouble( &m_frus_right );
    if (rc) rc = file.ReadDouble( &m_frus_bottom );
    if (rc) rc = file.ReadDouble( &m_frus_top );
    if (rc) rc = file.ReadDouble( &m_frus_near );
    if (rc) rc = file.ReadDouble( &m_frus_far );
    if (rc) rc = file.ReadInt( &m_port_left );
    if (rc) rc = file.ReadInt( &m_port_right );
    if (rc) rc = file.ReadInt( &m_port_bottom );
    if (rc) rc = file.ReadInt( &m_port_top );
    if (rc) rc = file.ReadInt( &m_port_near );
    if (rc) rc = file.ReadInt( &m_port_far );   

    if ( m_bValidCamera )
    {
      if ( !ON_Viewport::IsValidCameraLocation(m_CamLoc) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
      }
      if ( !ON_Viewport::IsValidCameraUpOrDirection(m_CamUp) || !ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
      {
        ON_ERROR("ON_Viewport.m_bValidCamera in file was true and it should be false.");
        m_bValidCamera = false;
        m_bValidCameraFrame = false;
      }
      if (!m_bValidCamera)
      {
        if (ON::view_projection::perspective_view == m_projection)
          SetCamera(ON_Viewport::DefaultPerspectiveViewZUp, true);
        else
          SetCamera(ON_Viewport::DefaultTopViewYUp, true);
      }
    }

    if (rc && minor_version >= 1 )
    {
      // 1.1 fields
      if (rc) rc = file.ReadUuid(m_viewport_id);

      if (rc && minor_version >= 2 )
      {
        // 1.2 fields 
        bool b;
        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraUpLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraDirectionLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetCameraLocationLock(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumLeftRightSymmetry(b);

        b = false;
        if (rc) rc = file.ReadBool(&b);
        if (rc) SetFrustumTopBottomSymmetry(b);

        if (rc && minor_version >= 3 )
        {
          // added 18, June 2013 to V6
          rc = file.ReadPoint(m_target_point);

          if (rc && minor_version >= 4)
          {
            rc = file.ReadBool(&m_bValidCameraFrame);

            if (rc && minor_version >= 5)
            {
              double scaleX = 1, scaleY = 1, scaleZ = 1;
              rc = file.ReadDouble(&scaleX);
              if (rc) rc = file.ReadDouble(&scaleY);
              if (rc) rc = file.ReadDouble(&scaleZ);
              if (rc)
              {
                SetViewScale(scaleX, scaleY, scaleZ);
              }
            }
          }
        }
      }
    }

    if( m_bValidFrustum )
    {
      if (    !ON_IsValid(m_frus_left) || !ON_IsValid(m_frus_right)
           || !ON_IsValid(m_frus_top)  || !ON_IsValid(m_frus_bottom)
           || !ON_IsValid(m_frus_near) || !ON_IsValid(m_frus_far)
           || !(m_frus_left < m_frus_right)
           || !(m_frus_bottom < m_frus_top)
           || !(0.0 < m_frus_near)
           || !(m_frus_near < m_frus_far)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_left)
           || !(m_frus_right < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(-ON_NONSENSE_WORLD_COORDINATE_VALUE < m_frus_bottom)
           || !(m_frus_top < ON_NONSENSE_WORLD_COORDINATE_VALUE)
           || !(m_frus_far < ON_NONSENSE_WORLD_COORDINATE_VALUE)
         )
      {
        ON_ERROR("ON_Viewport.m_bValidFrustum in file was true and it should be false.");
        m_bValidFrustum = false;
      }
    }
  }
  return rc;
}